

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1352d2::MkdirCommand::~MkdirCommand(MkdirCommand *this)

{
  llbuild::buildsystem::ExternalCommand::~ExternalCommand(&this->super_ExternalCommand);
  operator_delete(this,0x138);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getDescription();
  }